

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to16.h
# Opt level: O2

void ncnn::im2col_sgemm_pack1to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  uint _h;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  int *piVar14;
  _func_int ***ppp_Var15;
  uint _c;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [64];
  undefined1 (*pauVar19) [32];
  long lVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  undefined4 *puVar25;
  undefined1 (*pauVar26) [64];
  byte bVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [64];
  long lVar30;
  undefined1 (*pauVar31) [16];
  int q;
  int iVar32;
  ulong uVar33;
  long lVar34;
  undefined4 *puVar35;
  ulong uVar36;
  bool bVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 local_f8 [64];
  size_t local_b8;
  ulong local_a8;
  ulong local_a0;
  Mat *local_98;
  long local_90;
  Allocator *local_88;
  void *local_80;
  float zeros [16];
  
  uVar3 = bottom_im2col->w;
  uVar36 = (ulong)(int)uVar3;
  uVar22 = bottom_im2col->h;
  local_a8 = (ulong)uVar22;
  _h = bottom_im2col->c;
  local_a0 = (ulong)(uint)top_blob->c;
  local_80 = _bias->data;
  local_b8 = 0;
  local_f8._0_8_ = (Allocator *)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_f8._24_4_ = 0;
  local_f8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar36 < 8) {
    _c = uVar3;
    if (3 < (int)uVar3) {
      uVar22 = uVar22 * 4;
      _c = (uVar3 & 3) + 1;
    }
  }
  else {
    uVar22 = uVar22 * 8;
    _c = (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0);
  }
  local_f8._32_8_ = local_f8._0_8_;
  local_f8._40_4_ = local_f8._8_4_;
  local_f8._44_4_ = local_f8._12_4_;
  local_98 = top_blob;
  Mat::create((Mat *)local_f8,uVar22,_h,_c,4,1,opt->workspace_allocator);
  uVar16 = 0;
  iVar23 = (int)local_a8;
  iVar32 = 0;
  if (0 < iVar23) {
    iVar32 = iVar23;
  }
  uVar28 = 0;
  if (0 < (int)_h) {
    uVar28 = (ulong)_h;
  }
  uVar17 = (ulong)(uint)((int)uVar3 >> 3);
  if ((int)uVar3 >> 3 < 1) {
    uVar17 = uVar16;
  }
  for (uVar24 = 0; uVar24 != uVar17; uVar24 = uVar24 + 1) {
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_f8._0_8_ + local_b8 * uVar24 * local_f8._16_8_);
    for (uVar33 = 0; uVar33 != uVar28; uVar33 = uVar33 + 1) {
      pauVar19 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar33 + uVar16);
      iVar21 = iVar32;
      while (bVar37 = iVar21 != 0, iVar21 = iVar21 + -1, bVar37) {
        *(undefined1 (*) [32])ppp_Var15 = *pauVar19;
        ppp_Var15 = ppp_Var15 + 4;
        pauVar19 = (undefined1 (*) [32])(*pauVar19 + uVar36 * 4);
      }
    }
    uVar16 = uVar16 + 0x20;
  }
  uVar22 = uVar3 >> 2 & 1;
  lVar34 = (uVar36 & 0xfffffffffffffff8) << 2;
  for (uVar16 = 0; iVar21 = (int)(uVar36 & 0xfffffffffffffff8), uVar16 != uVar22;
      uVar16 = uVar16 + 1) {
    iVar21 = iVar21 + (int)uVar16 * 4;
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_f8._0_8_ +
                (long)((iVar21 % 8 >> 2) + iVar21 / 8) * local_b8 * local_f8._16_8_);
    for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
      pauVar31 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar17 + lVar34);
      iVar21 = iVar32;
      while (bVar37 = iVar21 != 0, iVar21 = iVar21 + -1, bVar37) {
        *(undefined1 (*) [16])ppp_Var15 = *pauVar31;
        ppp_Var15 = ppp_Var15 + 2;
        pauVar31 = (undefined1 (*) [16])(*pauVar31 + uVar36 * 4);
      }
    }
    lVar34 = lVar34 + 0x10;
  }
  local_88 = (Allocator *)local_f8._0_8_;
  local_90 = local_b8 * local_f8._16_8_;
  uVar16 = (ulong)(int)(iVar21 + uVar22 * 4);
  lVar34 = uVar16 * 4;
  for (; (long)uVar16 < (long)uVar36; uVar16 = uVar16 + 1) {
    uVar22 = (int)uVar16 >> 0x1f;
    uVar17 = (ulong)uVar22 << 0x20 | uVar16 & 0xffffffff;
    sVar4 = bottom_im2col->cstep;
    sVar5 = bottom_im2col->elemsize;
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_f8._0_8_ +
                ((int)((long)((ulong)uVar22 << 0x20 | uVar16 & 0xffffffff) % 4) +
                 (int)((long)uVar17 / 8) + (int)(char)((char)((long)uVar17 % 8) / '\x04')) *
                local_90);
    puVar35 = (undefined4 *)((long)bottom_im2col->data + lVar34);
    for (uVar17 = 0; puVar25 = puVar35, iVar21 = iVar32, uVar17 != uVar28; uVar17 = uVar17 + 1) {
      while (iVar21 != 0) {
        *(undefined4 *)ppp_Var15 = *puVar25;
        ppp_Var15 = (_func_int ***)((long)ppp_Var15 + 4);
        puVar25 = puVar25 + uVar36;
        iVar21 = iVar21 + -1;
      }
      puVar35 = (undefined4 *)((long)puVar35 + sVar4 * sVar5);
    }
    lVar34 = lVar34 + 4;
  }
  uVar28 = 0;
  uVar16 = (ulong)(_h * iVar23);
  if ((int)(_h * iVar23) < 1) {
    uVar16 = uVar28;
  }
  uVar17 = local_a0 & 0xffffffff;
  if ((int)local_a0 < 1) {
    uVar17 = uVar28;
  }
  for (; uVar28 != uVar17; uVar28 = uVar28 + 1) {
    pauVar18 = (undefined1 (*) [64])
               (local_98->cstep * uVar28 * local_98->elemsize + (long)local_98->data);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    zeros[8] = 0.0;
    zeros[9] = 0.0;
    zeros[10] = 0.0;
    zeros[0xb] = 0.0;
    zeros[0xc] = 0.0;
    zeros[0xd] = 0.0;
    zeros[0xe] = 0.0;
    zeros[0xf] = 0.0;
    pauVar26 = (undefined1 (*) [64])(uVar28 * 0x40 + (long)local_80);
    if (local_80 == (void *)0x0) {
      pauVar26 = (undefined1 (*) [64])zeros;
    }
    lVar34 = 0;
    for (uVar24 = 0; (long)(uVar24 | 7) < (long)uVar36; uVar24 = uVar24 + 8) {
      lVar30 = local_b8 * local_f8._16_8_ * lVar34;
      auVar38 = *pauVar26;
      lVar20 = 0;
      uVar33 = uVar16;
      auVar39 = auVar38;
      auVar40 = auVar38;
      auVar41 = auVar38;
      auVar42 = auVar38;
      auVar43 = auVar38;
      auVar44 = auVar38;
      auVar45 = auVar38;
      while (iVar32 = (int)uVar33, uVar33 = (ulong)(iVar32 - 1), iVar32 != 0) {
        auVar2 = *(undefined1 (*) [64])
                  ((long)kernel->data + lVar20 * 2 + kernel->cstep * uVar28 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)(_func_int ***)local_f8._0_8_ + lVar20 + lVar30);
        auVar6._4_4_ = uVar1;
        auVar6._0_4_ = uVar1;
        auVar6._8_4_ = uVar1;
        auVar6._12_4_ = uVar1;
        auVar6._16_4_ = uVar1;
        auVar6._20_4_ = uVar1;
        auVar6._24_4_ = uVar1;
        auVar6._28_4_ = uVar1;
        auVar6._32_4_ = uVar1;
        auVar6._36_4_ = uVar1;
        auVar6._40_4_ = uVar1;
        auVar6._44_4_ = uVar1;
        auVar6._48_4_ = uVar1;
        auVar6._52_4_ = uVar1;
        auVar6._56_4_ = uVar1;
        auVar6._60_4_ = uVar1;
        auVar38 = vfmadd231ps_avx512f(auVar38,auVar2,auVar6);
        uVar1 = *(undefined4 *)((long)(_func_int ***)local_f8._0_8_ + lVar20 + lVar30 + 4);
        auVar7._4_4_ = uVar1;
        auVar7._0_4_ = uVar1;
        auVar7._8_4_ = uVar1;
        auVar7._12_4_ = uVar1;
        auVar7._16_4_ = uVar1;
        auVar7._20_4_ = uVar1;
        auVar7._24_4_ = uVar1;
        auVar7._28_4_ = uVar1;
        auVar7._32_4_ = uVar1;
        auVar7._36_4_ = uVar1;
        auVar7._40_4_ = uVar1;
        auVar7._44_4_ = uVar1;
        auVar7._48_4_ = uVar1;
        auVar7._52_4_ = uVar1;
        auVar7._56_4_ = uVar1;
        auVar7._60_4_ = uVar1;
        auVar39 = vfmadd231ps_avx512f(auVar39,auVar2,auVar7);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 8))->_vptr_Allocator + lVar20 + lVar30);
        auVar8._4_4_ = uVar1;
        auVar8._0_4_ = uVar1;
        auVar8._8_4_ = uVar1;
        auVar8._12_4_ = uVar1;
        auVar8._16_4_ = uVar1;
        auVar8._20_4_ = uVar1;
        auVar8._24_4_ = uVar1;
        auVar8._28_4_ = uVar1;
        auVar8._32_4_ = uVar1;
        auVar8._36_4_ = uVar1;
        auVar8._40_4_ = uVar1;
        auVar8._44_4_ = uVar1;
        auVar8._48_4_ = uVar1;
        auVar8._52_4_ = uVar1;
        auVar8._56_4_ = uVar1;
        auVar8._60_4_ = uVar1;
        auVar40 = vfmadd231ps_avx512f(auVar40,auVar2,auVar8);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 8))->_vptr_Allocator + lVar20 + lVar30 + 4)
        ;
        auVar9._4_4_ = uVar1;
        auVar9._0_4_ = uVar1;
        auVar9._8_4_ = uVar1;
        auVar9._12_4_ = uVar1;
        auVar9._16_4_ = uVar1;
        auVar9._20_4_ = uVar1;
        auVar9._24_4_ = uVar1;
        auVar9._28_4_ = uVar1;
        auVar9._32_4_ = uVar1;
        auVar9._36_4_ = uVar1;
        auVar9._40_4_ = uVar1;
        auVar9._44_4_ = uVar1;
        auVar9._48_4_ = uVar1;
        auVar9._52_4_ = uVar1;
        auVar9._56_4_ = uVar1;
        auVar9._60_4_ = uVar1;
        auVar41 = vfmadd231ps_avx512f(auVar41,auVar2,auVar9);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 0x10))->_vptr_Allocator + lVar20 + lVar30);
        auVar10._4_4_ = uVar1;
        auVar10._0_4_ = uVar1;
        auVar10._8_4_ = uVar1;
        auVar10._12_4_ = uVar1;
        auVar10._16_4_ = uVar1;
        auVar10._20_4_ = uVar1;
        auVar10._24_4_ = uVar1;
        auVar10._28_4_ = uVar1;
        auVar10._32_4_ = uVar1;
        auVar10._36_4_ = uVar1;
        auVar10._40_4_ = uVar1;
        auVar10._44_4_ = uVar1;
        auVar10._48_4_ = uVar1;
        auVar10._52_4_ = uVar1;
        auVar10._56_4_ = uVar1;
        auVar10._60_4_ = uVar1;
        auVar42 = vfmadd231ps_avx512f(auVar42,auVar2,auVar10);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 0x10))->_vptr_Allocator +
                 lVar20 + lVar30 + 4);
        auVar11._4_4_ = uVar1;
        auVar11._0_4_ = uVar1;
        auVar11._8_4_ = uVar1;
        auVar11._12_4_ = uVar1;
        auVar11._16_4_ = uVar1;
        auVar11._20_4_ = uVar1;
        auVar11._24_4_ = uVar1;
        auVar11._28_4_ = uVar1;
        auVar11._32_4_ = uVar1;
        auVar11._36_4_ = uVar1;
        auVar11._40_4_ = uVar1;
        auVar11._44_4_ = uVar1;
        auVar11._48_4_ = uVar1;
        auVar11._52_4_ = uVar1;
        auVar11._56_4_ = uVar1;
        auVar11._60_4_ = uVar1;
        auVar43 = vfmadd231ps_avx512f(auVar43,auVar2,auVar11);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 0x18))->_vptr_Allocator + lVar20 + lVar30);
        auVar12._4_4_ = uVar1;
        auVar12._0_4_ = uVar1;
        auVar12._8_4_ = uVar1;
        auVar12._12_4_ = uVar1;
        auVar12._16_4_ = uVar1;
        auVar12._20_4_ = uVar1;
        auVar12._24_4_ = uVar1;
        auVar12._28_4_ = uVar1;
        auVar12._32_4_ = uVar1;
        auVar12._36_4_ = uVar1;
        auVar12._40_4_ = uVar1;
        auVar12._44_4_ = uVar1;
        auVar12._48_4_ = uVar1;
        auVar12._52_4_ = uVar1;
        auVar12._56_4_ = uVar1;
        auVar12._60_4_ = uVar1;
        auVar44 = vfmadd231ps_avx512f(auVar44,auVar2,auVar12);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 0x18))->_vptr_Allocator +
                 lVar20 + lVar30 + 4);
        auVar13._4_4_ = uVar1;
        auVar13._0_4_ = uVar1;
        auVar13._8_4_ = uVar1;
        auVar13._12_4_ = uVar1;
        auVar13._16_4_ = uVar1;
        auVar13._20_4_ = uVar1;
        auVar13._24_4_ = uVar1;
        auVar13._28_4_ = uVar1;
        auVar13._32_4_ = uVar1;
        auVar13._36_4_ = uVar1;
        auVar13._40_4_ = uVar1;
        auVar13._44_4_ = uVar1;
        auVar13._48_4_ = uVar1;
        auVar13._52_4_ = uVar1;
        auVar13._56_4_ = uVar1;
        auVar13._60_4_ = uVar1;
        auVar45 = vfmadd231ps_avx512f(auVar45,auVar2,auVar13);
        lVar20 = lVar20 + 0x20;
      }
      *pauVar18 = auVar38;
      pauVar18[1] = auVar39;
      pauVar18[2] = auVar40;
      pauVar18[3] = auVar41;
      pauVar18[4] = auVar42;
      pauVar18[5] = auVar43;
      pauVar18[6] = auVar44;
      pauVar18[7] = auVar45;
      pauVar18 = pauVar18 + 8;
      lVar34 = lVar34 + 1;
    }
    bVar27 = 0;
    for (; (int)((uint)uVar24 | 3) < (int)uVar3; uVar24 = (ulong)((uint)uVar24 + 4)) {
      lVar20 = local_b8 * local_f8._16_8_ *
               (ulong)((bVar27 & 1) + ((uint)(uVar24 >> 3) & 0x1fffffff));
      auVar38 = *pauVar26;
      lVar34 = 0;
      uVar33 = uVar16;
      auVar39 = auVar38;
      auVar40 = auVar38;
      auVar41 = auVar38;
      while (iVar32 = (int)uVar33, uVar33 = (ulong)(iVar32 - 1), iVar32 != 0) {
        auVar42 = *(undefined1 (*) [64])
                   ((long)kernel->data + lVar34 * 4 + kernel->cstep * uVar28 * kernel->elemsize);
        uVar1 = *(undefined4 *)((long)(_func_int ***)local_f8._0_8_ + lVar34 + lVar20);
        auVar43._4_4_ = uVar1;
        auVar43._0_4_ = uVar1;
        auVar43._8_4_ = uVar1;
        auVar43._12_4_ = uVar1;
        auVar43._16_4_ = uVar1;
        auVar43._20_4_ = uVar1;
        auVar43._24_4_ = uVar1;
        auVar43._28_4_ = uVar1;
        auVar43._32_4_ = uVar1;
        auVar43._36_4_ = uVar1;
        auVar43._40_4_ = uVar1;
        auVar43._44_4_ = uVar1;
        auVar43._48_4_ = uVar1;
        auVar43._52_4_ = uVar1;
        auVar43._56_4_ = uVar1;
        auVar43._60_4_ = uVar1;
        auVar38 = vfmadd231ps_avx512f(auVar38,auVar42,auVar43);
        uVar1 = *(undefined4 *)((long)(_func_int ***)local_f8._0_8_ + lVar34 + lVar20 + 4);
        auVar44._4_4_ = uVar1;
        auVar44._0_4_ = uVar1;
        auVar44._8_4_ = uVar1;
        auVar44._12_4_ = uVar1;
        auVar44._16_4_ = uVar1;
        auVar44._20_4_ = uVar1;
        auVar44._24_4_ = uVar1;
        auVar44._28_4_ = uVar1;
        auVar44._32_4_ = uVar1;
        auVar44._36_4_ = uVar1;
        auVar44._40_4_ = uVar1;
        auVar44._44_4_ = uVar1;
        auVar44._48_4_ = uVar1;
        auVar44._52_4_ = uVar1;
        auVar44._56_4_ = uVar1;
        auVar44._60_4_ = uVar1;
        auVar39 = vfmadd231ps_avx512f(auVar39,auVar42,auVar44);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 8))->_vptr_Allocator + lVar34 + lVar20);
        auVar45._4_4_ = uVar1;
        auVar45._0_4_ = uVar1;
        auVar45._8_4_ = uVar1;
        auVar45._12_4_ = uVar1;
        auVar45._16_4_ = uVar1;
        auVar45._20_4_ = uVar1;
        auVar45._24_4_ = uVar1;
        auVar45._28_4_ = uVar1;
        auVar45._32_4_ = uVar1;
        auVar45._36_4_ = uVar1;
        auVar45._40_4_ = uVar1;
        auVar45._44_4_ = uVar1;
        auVar45._48_4_ = uVar1;
        auVar45._52_4_ = uVar1;
        auVar45._56_4_ = uVar1;
        auVar45._60_4_ = uVar1;
        auVar40 = vfmadd231ps_avx512f(auVar40,auVar42,auVar45);
        uVar1 = *(undefined4 *)
                 ((long)&((Allocator *)(local_f8._0_8_ + 8))->_vptr_Allocator + lVar34 + lVar20 + 4)
        ;
        auVar2._4_4_ = uVar1;
        auVar2._0_4_ = uVar1;
        auVar2._8_4_ = uVar1;
        auVar2._12_4_ = uVar1;
        auVar2._16_4_ = uVar1;
        auVar2._20_4_ = uVar1;
        auVar2._24_4_ = uVar1;
        auVar2._28_4_ = uVar1;
        auVar2._32_4_ = uVar1;
        auVar2._36_4_ = uVar1;
        auVar2._40_4_ = uVar1;
        auVar2._44_4_ = uVar1;
        auVar2._48_4_ = uVar1;
        auVar2._52_4_ = uVar1;
        auVar2._56_4_ = uVar1;
        auVar2._60_4_ = uVar1;
        auVar41 = vfmadd231ps_avx512f(auVar41,auVar42,auVar2);
        lVar34 = lVar34 + 0x10;
      }
      *pauVar18 = auVar38;
      pauVar18[1] = auVar39;
      pauVar18[2] = auVar40;
      pauVar18[3] = auVar41;
      pauVar18 = pauVar18 + 4;
      bVar27 = bVar27 + 1;
    }
    while( true ) {
      uVar22 = (uint)uVar24;
      if ((int)uVar3 <= (int)uVar22) break;
      pauVar29 = (undefined1 (*) [64])
                 (kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
      auVar38 = *pauVar26;
      for (lVar34 = 0; (int)uVar16 != (int)lVar34; lVar34 = lVar34 + 1) {
        uVar1 = *(undefined4 *)
                 ((long)(_func_int ***)local_f8._0_8_ +
                 lVar34 * 4 +
                 local_b8 * local_f8._16_8_ *
                 (ulong)((uVar22 & 3) + ((uint)(uVar24 >> 3) & 0x1fffffff) +
                        (uint)((uVar22 >> 2 & 1) != 0)));
        auVar39._4_4_ = uVar1;
        auVar39._0_4_ = uVar1;
        auVar39._8_4_ = uVar1;
        auVar39._12_4_ = uVar1;
        auVar39._16_4_ = uVar1;
        auVar39._20_4_ = uVar1;
        auVar39._24_4_ = uVar1;
        auVar39._28_4_ = uVar1;
        auVar39._32_4_ = uVar1;
        auVar39._36_4_ = uVar1;
        auVar39._40_4_ = uVar1;
        auVar39._44_4_ = uVar1;
        auVar39._48_4_ = uVar1;
        auVar39._52_4_ = uVar1;
        auVar39._56_4_ = uVar1;
        auVar39._60_4_ = uVar1;
        auVar38 = vfmadd231ps_avx512f(auVar38,*pauVar29,auVar39);
        pauVar29 = pauVar29 + 1;
      }
      *pauVar18 = auVar38;
      pauVar18 = pauVar18 + 1;
      uVar24 = (ulong)(uVar22 + 1);
    }
  }
  piVar14 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
        free((void *)local_f8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_f8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            outptr0 += 128;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 32, _sum2);
            _mm512_store_ps(outptr0 + 48, _sum3);
            outptr0 += 64;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);
                __m512 _val = _mm512_set1_ps(tmpptr[0]);
                _sum = _mm512_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum);
            outptr0 += 16;
        }
    }
}